

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImNodes.cpp
# Opt level: O1

void ImNodes::BeginCanvas(CanvasState *canvas)

{
  ImGuiWindow *pIVar1;
  bool bVar2;
  ImGuiID id;
  ImU32 col;
  ImDrawList *this;
  ImGuiIO *pIVar3;
  float fVar4;
  float fVar5;
  ImVec2 IVar6;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  ImVec2 local_90;
  ImVec2 local_88;
  undefined8 uStack_80;
  ImVec2 local_78;
  undefined8 uStack_70;
  ImVec4 local_68;
  undefined1 local_58 [8];
  float fStack_50;
  float fStack_4c;
  undefined1 local_48 [8];
  float fStack_40;
  float fStack_3c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  
  canvas->_impl->prev_canvas = gCanvas;
  pIVar1 = GImGui->CurrentWindow;
  gCanvas = canvas;
  pIVar1->WriteAccessed = true;
  ImGui::PushID(canvas);
  id = ImGui::GetID("canvas");
  ImGui::ItemAdd(&pIVar1->ContentsRegionRect,id,(ImRect *)0x0);
  this = ImGui::GetWindowDrawList();
  pIVar3 = ImGui::GetIO();
  bVar2 = ImGui::IsMouseDown(0);
  if ((!bVar2) && (bVar2 = ImGui::IsWindowHovered(0), bVar2)) {
    bVar2 = ImGui::IsMouseDragging(1,-1.0);
    if (bVar2) {
      (canvas->offset).x = (pIVar3->MouseDelta).x + (canvas->offset).x;
      (canvas->offset).y = (pIVar3->MouseDelta).y + (canvas->offset).y;
    }
    bVar2 = pIVar3->KeyShift;
    if (bVar2 == true) {
      if (pIVar3->KeyCtrl == false) {
        (canvas->offset).x = pIVar3->MouseWheel * 16.0 + (canvas->offset).x;
      }
    }
    else {
      if (pIVar3->KeyCtrl == false) {
        (canvas->offset).y = pIVar3->MouseWheel * 16.0 + (canvas->offset).y;
      }
      if ((bVar2 == false) && (pIVar3->KeyCtrl == true)) {
        fVar5 = pIVar3->MouseWheel;
        if ((fVar5 != 0.0) || (NAN(fVar5))) {
          fVar4 = fVar5 * canvas->zoom * 0.0625 + canvas->zoom;
          fVar5 = 3.0;
          if (fVar4 <= 3.0) {
            fVar5 = fVar4;
          }
          canvas->zoom = (float)(-(uint)(fVar4 < 0.3) & 0x3e99999a |
                                ~-(uint)(fVar4 < 0.3) & (uint)fVar5);
        }
        IVar6 = ImGui::GetMouseDragDelta(0,-1.0);
        (canvas->offset).x = (canvas->offset).x + IVar6.x;
        (canvas->offset).y = IVar6.y + (canvas->offset).y;
      }
    }
  }
  fVar5 = canvas->zoom * 64.0;
  local_78 = ImGui::GetWindowPos();
  uStack_70 = extraout_XMM0_Qb;
  local_88 = ImGui::GetWindowSize();
  local_68.x = canvas->colors[0].Value.x;
  local_68.y = canvas->colors[0].Value.y;
  local_68.z = canvas->colors[0].Value.z;
  local_68.w = canvas->colors[0].Value.w;
  uStack_80 = extraout_XMM0_Qb_00;
  col = ImGui::ColorConvertFloat4ToU32(&local_68);
  fVar4 = fmodf((canvas->offset).x,fVar5);
  local_38 = local_78.y;
  fStack_34 = local_78.y;
  fStack_30 = local_78.y;
  fStack_2c = local_78.y;
  if (fVar4 < local_88.x) {
    _local_48 = ZEXT416((uint)(local_78.y + 0.0));
    local_58._4_4_ = local_78.y + local_88.y;
    local_58._0_4_ = local_78.x + local_88.x;
    fStack_50 = (float)uStack_70 + (float)uStack_80;
    fStack_4c = uStack_70._4_4_ + uStack_80._4_4_;
    do {
      local_68.y = (float)local_48._0_4_;
      local_68.x = local_78.x + fVar4;
      local_90.y = (float)local_58._4_4_;
      local_90.x = local_78.x + fVar4;
      ImDrawList::AddLine(this,(ImVec2 *)&local_68,&local_90,col,1.0);
      fVar4 = fVar4 + fVar5;
    } while (fVar4 < local_88.x);
  }
  fVar4 = fmodf((canvas->offset).y,fVar5);
  if (fVar4 < local_88.y) {
    _local_58 = ZEXT416((uint)(local_78.x + 0.0));
    local_78.y = local_78.y + local_88.y;
    local_78.x = local_78.x + local_88.x;
    uStack_70 = CONCAT44(uStack_70._4_4_ + uStack_80._4_4_,(float)uStack_70 + (float)uStack_80);
    local_48._4_4_ = local_88.y;
    local_48._0_4_ = local_88.y;
    fStack_40 = local_88.y;
    fStack_3c = local_88.y;
    do {
      local_68.y = local_38 + fVar4;
      local_68.x = (float)local_58._0_4_;
      local_90.y = local_38 + fVar4;
      local_90.x = local_78.x;
      ImDrawList::AddLine(this,(ImVec2 *)&local_68,&local_90,col,1.0);
      fVar4 = fVar4 + fVar5;
    } while (fVar4 < (float)local_48._0_4_);
  }
  ImGui::SetWindowFontScale(canvas->zoom);
  return;
}

Assistant:

void BeginCanvas(CanvasState* canvas)
{
    canvas->_impl->prev_canvas = gCanvas;
    gCanvas = canvas;
    const ImGuiWindow* w = ImGui::GetCurrentWindow();
    ImGui::PushID(canvas);

    ImGui::ItemAdd(w->ContentsRegionRect, ImGui::GetID("canvas"));

    ImDrawList* draw_list = ImGui::GetWindowDrawList();
    ImGuiIO& io = ImGui::GetIO();

    if (!ImGui::IsMouseDown(0) && ImGui::IsWindowHovered())
    {
        if (ImGui::IsMouseDragging(1))
            canvas->offset += io.MouseDelta;

        if (io.KeyShift && !io.KeyCtrl)
            canvas->offset.x += io.MouseWheel * 16.0f;

        if (!io.KeyShift && !io.KeyCtrl)
            canvas->offset.y += io.MouseWheel * 16.0f;

        if (!io.KeyShift && io.KeyCtrl)
        {
            if (io.MouseWheel != 0)
                canvas->zoom = ImClamp(canvas->zoom + io.MouseWheel * canvas->zoom / 16.f, 0.3f, 3.f);
            canvas->offset += ImGui::GetMouseDragDelta();
        }
    }

    const float grid = 64.0f * canvas->zoom;

    ImVec2 pos = ImGui::GetWindowPos();
    ImVec2 size = ImGui::GetWindowSize();

    ImU32 grid_color = ImColor(canvas->colors[ColCanvasLines]);
    for (float x = fmodf(canvas->offset.x, grid); x < size.x;)
    {
        draw_list->AddLine(ImVec2(x, 0) + pos, ImVec2(x, size.y) + pos, grid_color);
        x += grid;
    }

    for (float y = fmodf(canvas->offset.y, grid); y < size.y;)
    {
        draw_list->AddLine(ImVec2(0, y) + pos, ImVec2(size.x, y) + pos, grid_color);
        y += grid;
    }

    ImGui::SetWindowFontScale(canvas->zoom);
}